

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>
::val(FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  vVar2 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  return vVar2 + vVar1;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}